

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::DistItemSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,DistItemSyntax *this,size_t index)

{
  SyntaxNode *node;
  size_t index_local;
  DistItemSyntax *this_local;
  
  if (index == 0) {
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->range)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
  }
  else if (index == 1) {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->weight->super_SyntaxNode);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax DistItemSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return range.get();
        case 1: return weight;
        default: return nullptr;
    }
}